

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *pcVar1;
  allocator<char> local_31;
  string local_30 [32];
  
  pcVar1 = cmLocalGenerator::CreateRulePlaceholderExpander((cmLocalGenerator *)this);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"$TARGET_IMPLIB",&local_31);
  std::__cxx11::string::_M_assign((string *)&pcVar1->TargetImpLib);
  std::__cxx11::string::~string(local_30);
  return pcVar1;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    this->cmLocalGenerator::CreateRulePlaceholderExpander();
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}